

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.c
# Opt level: O0

receiver * init_receiver(char name,int num_ch,int ch_ofs)

{
  receiver *__s;
  filter *pfVar1;
  demod_state_t *pdVar2;
  receiver *rx;
  int ch_ofs_local;
  int num_ch_local;
  char name_local;
  
  __s = (receiver *)hmalloc(0x38);
  memset(__s,0,0x38);
  pfVar1 = filter_init(0x24,coeffs);
  __s->filter = pfVar1;
  pdVar2 = (demod_state_t *)hmalloc(0x70);
  __s->decoder = pdVar2;
  protodec_initialize(__s->decoder,(serial_state_t *)0x0,name);
  __s->name = name;
  __s->lastbit = 0;
  __s->num_ch = num_ch;
  __s->ch_ofs = ch_ofs;
  __s->pll = 0;
  __s->pllinc = 0x3333;
  __s->prev = 0;
  __s->last_levellog = 0;
  return __s;
}

Assistant:

struct receiver *init_receiver(char name, int num_ch, int ch_ofs)
{
	struct receiver *rx;

	rx = (struct receiver *) hmalloc(sizeof(struct receiver));
	memset(rx, 0, sizeof(struct receiver));

	rx->filter = filter_init(COEFFS_L, coeffs);

    rx->decoder = hmalloc(sizeof(struct demod_state_t));
	protodec_initialize(rx->decoder, NULL, name);

    rx->name = name;
	rx->lastbit = 0;
	rx->num_ch = num_ch;
	rx->ch_ofs = ch_ofs;
	rx->pll = 0;
	rx->pllinc = 0x10000 / 5;
	rx->prev = 0;
	rx->last_levellog = 0;

	return rx;
}